

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_short,_short>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_short,_short> *this)

{
  short sVar1;
  ushort uVar2;
  unsigned_short uVar3;
  unsigned_short *puVar4;
  short sVar5;
  bool bVar6;
  uint16_t right;
  idx_t iVar7;
  unsigned_long uVar8;
  byte bVar9;
  uint16_t left;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  byte bVar13;
  ulong uVar14;
  
  bVar12 = true;
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (this->all_invalid == false) {
    right = this->minimum;
    left = this->maximum;
    if (left != right) goto LAB_01721921;
  }
  if ((byte)(this->mode - AUTO) < 2) {
    this->total_size = this->total_size + 6;
    return true;
  }
  right = this->minimum;
  left = this->maximum;
LAB_01721921:
  puVar4 = &this->min_max_diff;
  bVar6 = TrySubtractOperator::Operation<unsigned_short,unsigned_short,unsigned_short>
                    (left,right,puVar4);
  this->can_do_for = bVar6;
  CalculateDeltaStats(this);
  if (this->can_do_delta == true) {
    sVar1 = this->minimum_delta;
    if ((this->maximum_delta == sVar1) && ((this->mode & ~AUTO) != DELTA_FOR)) {
      this->total_size = this->total_size + 8;
      return true;
    }
    uVar2 = this->min_max_delta_diff;
    if (uVar2 == 0) {
      bVar13 = 0;
    }
    else {
      sVar5 = 0xf;
      if (uVar2 != 0) {
        for (; uVar2 >> sVar5 == 0; sVar5 = sVar5 + -1) {
        }
      }
      bVar13 = 0x10;
      if (uVar2 < 0x4000) {
        bVar13 = 0x10 - ((byte)sVar5 ^ 0xf);
      }
    }
    uVar2 = *puVar4;
    if (uVar2 == 0) {
      bVar9 = 0;
    }
    else {
      sVar5 = 0xf;
      if (uVar2 != 0) {
        for (; uVar2 >> sVar5 == 0; sVar5 = sVar5 + -1) {
        }
      }
      bVar9 = 0x10;
      if (uVar2 < 0x4000) {
        bVar9 = 0x10 - ((byte)sVar5 ^ 0xf);
      }
    }
    if ((bVar13 < bVar9) && (this->mode != FOR)) {
      uVar14 = this->compression_buffer_idx;
      if (uVar14 == 0) {
        iVar7 = this->total_size + 0xc;
        uVar14 = 0;
      }
      else {
        uVar10 = 0;
        do {
          this->delta_buffer[uVar10] = this->delta_buffer[uVar10] - sVar1;
          uVar10 = uVar10 + 1;
        } while (uVar14 != uVar10);
        iVar7 = this->total_size + 0xc;
        this->total_size = iVar7;
        if ((uVar14 & 0x1f) != 0) {
          uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar14 & 0x1f);
          uVar14 = (uVar14 - uVar8) + 0x20;
          iVar7 = this->total_size;
        }
      }
      this->total_size = (bVar13 * uVar14 >> 3) + iVar7;
      return true;
    }
  }
  if (this->can_do_for == true) {
    uVar2 = *puVar4;
    if (uVar2 == 0) {
      uVar14 = 0;
    }
    else {
      sVar1 = 0xf;
      if (uVar2 != 0) {
        for (; uVar2 >> sVar1 == 0; sVar1 = sVar1 + -1) {
        }
      }
      bVar13 = 0x10;
      if (uVar2 < 0x4000) {
        bVar13 = ((byte)sVar1 ^ 0xf0) + 0x11;
      }
      uVar14 = (ulong)bVar13;
    }
    uVar10 = this->compression_buffer_idx;
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      puVar4 = this->compression_buffer;
      uVar3 = this->minimum;
      uVar11 = 0;
      do {
        puVar4[uVar11] = puVar4[uVar11] - uVar3;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
      if ((uVar10 & 0x1f) != 0) {
        uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar10 & 0x1f);
        uVar10 = (uVar10 - uVar8) + 0x20;
      }
    }
    this->total_size = this->total_size + (uVar10 * uVar14 >> 3) + 10;
  }
  else {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}